

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

uint ImGui::RoundScalarWithFormatT<unsigned_int>(char *format,ImGuiDataType data_type,uint v)

{
  char *pcVar1;
  char *pcVar2;
  size_t fmt_out_size;
  double dVar3;
  undefined8 uStack_80;
  char v_str [64];
  char fmt_sanitized [32];
  
  uStack_80 = 0x1a87cf;
  pcVar2 = ImParseFormatFindStart(format);
  if ((*pcVar2 == '%') && (pcVar2[1] != '%')) {
    uStack_80 = 0x1a87ea;
    ImParseFormatSanitizeForPrinting(pcVar2,fmt_sanitized,fmt_out_size);
    uStack_80 = 0x1a87fc;
    ImFormatString(v_str,0x40,fmt_sanitized,(ulong)v);
    pcVar2 = (char *)((long)&uStack_80 + 7);
    do {
      pcVar1 = pcVar2 + 1;
      pcVar2 = pcVar2 + 1;
    } while (*pcVar1 == ' ');
    uStack_80 = 0x1a8810;
    dVar3 = atof(pcVar2);
    v = (uint)(long)dVar3;
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    IM_UNUSED(data_type);
    IM_ASSERT(data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double);
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    ImParseFormatSanitizeForPrinting(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    v = (TYPE)ImAtof(p);

    return v;
}